

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O1

Lpk_Res_t * Lpk_MuxAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *pDelays;
  Lpk_Res_t *pLVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  Lpk_MuxAnalize::Res.nSuppSizeS = 0;
  Lpk_MuxAnalize::Res.nSuppSizeL = 0;
  Lpk_MuxAnalize::Res.DelayEst = 0;
  Lpk_MuxAnalize::Res.AreaEst = 0;
  Lpk_MuxAnalize::Res.nBSVars = 0;
  Lpk_MuxAnalize::Res.BSVars = 0;
  Lpk_MuxAnalize::Res.nCofVars = 0;
  Lpk_MuxAnalize::Res.pCofVars[0] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[1] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[2] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[3] = '\0';
  Lpk_MuxAnalize::Res.Variable = 0;
  Lpk_MuxAnalize::Res.Polarity = 0;
  if ((-1 << ((byte)(*(uint *)&p->field_0x8 >> 7) & 0x1f) ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0x33,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
    __assert_fail("p->fSupports",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0x34,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  Lpk_MuxAnalize::Res.Variable = -1;
  Lpk_MuxAnalize::Res.Polarity = 0;
  pDelays = p->pDelays;
  lVar14 = 0;
  do {
    uVar10 = 1 << ((byte)lVar14 & 0x1f);
    if ((p->uSupp >> ((uint)lVar14 & 0x1f) & 1) != 0) {
      uVar12 = p->puSupps[lVar14 * 2];
      uVar13 = (uVar12 >> 1 & 0x55555555) + (uVar12 & 0x55555555);
      uVar13 = (uVar13 >> 2 & 0x33333333) + (uVar13 & 0x33333333);
      uVar13 = (uVar13 >> 4 & 0x7070707) + (uVar13 & 0x7070707);
      uVar13 = (uVar13 >> 8 & 0xf000f) + (uVar13 & 0xf000f);
      uVar13 = (uVar13 >> 0x10) + (uVar13 & 0xff);
      uVar8 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
      if (uVar8 <= uVar13) {
        __assert_fail("nSuppSize0 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                      ,0x3b,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      uVar1 = p->puSupps[lVar14 * 2 + 1];
      uVar9 = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555);
      uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
      uVar9 = (uVar9 >> 4 & 0x7070707) + (uVar9 & 0x7070707);
      uVar9 = (uVar9 >> 8 & 0xf000f) + (uVar9 & 0xf000f);
      uVar9 = (uVar9 >> 0x10) + (uVar9 & 0xff);
      if (uVar8 <= uVar9) {
        __assert_fail("nSuppSize1 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                      ,0x3c,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      if ((uVar13 != 0) && (uVar9 != 0)) {
        uVar8 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
        iVar3 = uVar8 - 2;
        if ((iVar3 < (int)uVar13) || (iVar3 < (int)uVar9)) {
          if (iVar3 < (int)uVar13) {
            if (iVar3 < (int)uVar9) {
              if (uVar8 < uVar13) {
                if (uVar8 < uVar9) {
                  iVar3 = Lpk_SuppDelay(uVar12 | uVar10,pDelays);
                  iVar6 = Lpk_SuppDelay(p->puSupps[lVar14 * 2 + 1],pDelays);
                  iVar4 = iVar6 + 1;
                  if (iVar6 + 1 < iVar3) {
                    iVar4 = iVar3;
                  }
                  iVar3 = Lpk_SuppDelay(uVar10 | p->puSupps[lVar14 * 2 + 1],pDelays);
                  iVar6 = Lpk_SuppDelay(p->puSupps[lVar14 * 2],pDelays);
                  iVar5 = iVar6 + 1;
                  if (iVar6 + 1 < iVar3) {
                    iVar5 = iVar3;
                  }
                  iVar6 = (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1;
                  iVar3 = iVar5;
                  if (iVar4 < iVar5) {
                    iVar3 = iVar4;
                  }
                  uVar10 = uVar9;
                  uVar12 = uVar13;
                  if (iVar5 < iVar4) {
                    uVar10 = uVar13;
                    uVar12 = uVar9;
                  }
                  iVar6 = (((int)(uVar10 - 1) / iVar6 +
                            (int)((long)(ulong)(uVar12 + 1) / (long)iVar6) + 1) -
                          (uint)((int)((long)(ulong)(uVar12 + 1) % (long)iVar6) == 0)) +
                          (uint)(0 < (int)(uVar10 - 1) % iVar6);
                  bVar11 = iVar5 <= iVar4;
                }
                else {
                  iVar6 = Lpk_SuppDelay(uVar12 | uVar10,pDelays);
                  iVar4 = Lpk_SuppDelay(p->puSupps[lVar14 * 2 + 1],pDelays);
                  iVar3 = iVar4 + 1;
                  if (iVar4 + 1 < iVar6) {
                    iVar3 = iVar6;
                  }
                  lVar2 = (long)(int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1);
                  bVar11 = false;
                  iVar6 = ((int)((long)(ulong)(uVar13 + 1) / lVar2) -
                          (uint)((int)((long)(ulong)(uVar13 + 1) % lVar2) == 0)) + 2;
                }
                goto LAB_004dba1a;
              }
              iVar6 = Lpk_SuppDelay(uVar1 | uVar10,pDelays);
              iVar4 = Lpk_SuppDelay(p->puSupps[lVar14 * 2],pDelays);
              iVar3 = iVar4 + 1;
              if (iVar4 + 1 < iVar6) {
                iVar3 = iVar6;
              }
              lVar2 = (long)(int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1);
              iVar6 = ((int)((long)(ulong)(uVar9 + 1) / lVar2) -
                      (uint)((int)((long)(ulong)(uVar9 + 1) % lVar2) == 0)) + 2;
            }
            else {
              iVar6 = Lpk_SuppDelay(uVar1 | uVar10,pDelays);
              iVar4 = Lpk_SuppDelay(p->puSupps[lVar14 * 2],pDelays);
              iVar3 = iVar4 + 1;
              if (iVar4 + 1 < iVar6) {
                iVar3 = iVar6;
              }
              iVar6 = (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1;
              iVar6 = (int)(uVar13 - 1) / iVar6 + (uint)(0 < (int)(uVar13 - 1) % iVar6) + 1;
            }
            bVar11 = true;
          }
          else {
            iVar6 = Lpk_SuppDelay(uVar12 | uVar10,pDelays);
            iVar4 = Lpk_SuppDelay(p->puSupps[lVar14 * 2 + 1],pDelays);
            iVar3 = iVar4 + 1;
            if (iVar4 + 1 < iVar6) {
              iVar3 = iVar6;
            }
            iVar6 = (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1;
            iVar6 = (int)(uVar9 - 1) / iVar6 + (uint)(0 < (int)(uVar9 - 1) % iVar6) + 1;
            bVar11 = false;
          }
        }
        else {
          iVar3 = Lpk_SuppDelay(uVar12 | uVar10,pDelays);
          iVar4 = Lpk_SuppDelay(p->puSupps[lVar14 * 2 + 1],pDelays);
          iVar6 = iVar4 + 1;
          if (iVar4 + 1 < iVar3) {
            iVar6 = iVar3;
          }
          iVar3 = Lpk_SuppDelay(uVar10 | p->puSupps[lVar14 * 2 + 1],pDelays);
          iVar5 = Lpk_SuppDelay(p->puSupps[lVar14 * 2],pDelays);
          iVar4 = iVar5 + 1;
          if (iVar5 + 1 < iVar3) {
            iVar4 = iVar3;
          }
          iVar3 = iVar4;
          if (iVar6 < iVar4) {
            iVar3 = iVar6;
          }
          bVar11 = iVar4 <= iVar6;
          iVar6 = 2;
        }
LAB_004dba1a:
        if ((iVar3 <= (int)p->nDelayLim) &&
           (iVar6 <= (int)(*(uint *)&p->field_0x8 >> 0x10 & 0x3fff))) {
          uVar13 = uVar13 + (uint)(bVar11 ^ 1) * 2;
          uVar9 = uVar9 + (uint)bVar11 * 2;
          uVar10 = uVar9;
          if (uVar13 < uVar9) {
            uVar10 = uVar13;
          }
          uVar12 = uVar9;
          if (uVar9 < uVar13) {
            uVar12 = uVar13;
          }
          if (uVar12 <= (*(uint *)&p->field_0x8 >> 7 & 0x1f)) {
            if (Lpk_MuxAnalize::Res.Variable != -1) {
              if (Lpk_MuxAnalize::Res.AreaEst <= iVar6) {
                if (Lpk_MuxAnalize::Res.AreaEst == iVar6) {
                  if (((int)(uVar13 + uVar9) <
                       Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS) ||
                     (((Lpk_MuxAnalize::Res.AreaEst == iVar6 &&
                       (Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS ==
                        uVar13 + uVar9)) && (iVar3 < Lpk_MuxAnalize::Res.DelayEst))))
                  goto LAB_004dba9d;
                }
                goto LAB_004dbac2;
              }
            }
LAB_004dba9d:
            Lpk_MuxAnalize::Res.Polarity._0_1_ = bVar11;
            Lpk_MuxAnalize::Res.Variable = (uint)lVar14;
            Lpk_MuxAnalize::Res.Polarity._1_3_ = 0;
            Lpk_MuxAnalize::Res.AreaEst = iVar6;
            Lpk_MuxAnalize::Res.DelayEst = iVar3;
            Lpk_MuxAnalize::Res.nSuppSizeL = uVar12;
            Lpk_MuxAnalize::Res.nSuppSizeS = uVar10;
          }
        }
      }
    }
LAB_004dbac2:
    lVar14 = lVar14 + 1;
    if (lVar14 == 0x10) {
      pLVar7 = (Lpk_Res_t *)0x0;
      if (Lpk_MuxAnalize::Res.Variable != -1) {
        pLVar7 = &Lpk_MuxAnalize::Res;
      }
      return pLVar7;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the possibility of MUX decomposition.]

  Description [Returns the best variable to use for MUX decomposition.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Res_t * Lpk_MuxAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p )
{
    static Lpk_Res_t Res, * pRes = &Res;
    int nSuppSize0, nSuppSize1, nSuppSizeS, nSuppSizeL;
    int Var, Area, Polarity, Delay, Delay0, Delay1, DelayA, DelayB;
    memset( pRes, 0, sizeof(Lpk_Res_t) );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    assert( p->fSupports );
    // derive the delay and area after MUX-decomp with each var - and find the best var
    pRes->Variable = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        nSuppSize0 = Kit_WordCountOnes(p->puSupps[2*Var+0]);
        nSuppSize1 = Kit_WordCountOnes(p->puSupps[2*Var+1]);
        assert( nSuppSize0 < (int)p->nVars );
        assert( nSuppSize1 < (int)p->nVars );
        if ( nSuppSize0 < 1 || nSuppSize1 < 1 )
            continue;
//printf( "%d %d    ", nSuppSize0, nSuppSize1 );
        if ( nSuppSize0 <= (int)p->nLutK - 2 && nSuppSize1 <= (int)p->nLutK - 2 )
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            Area = 2;
            Polarity = (int)(Delay == Delay1);
        }
        else if ( nSuppSize0 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            Polarity = 0;
        }
        else if ( nSuppSize1 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize0 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1+2, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize1 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0+2, p->nLutK );
            Polarity = 0;
        }
        else
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            if ( Delay == Delay0 )
                Area = Lpk_LutNumLuts( nSuppSize0+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            else
                Area = Lpk_LutNumLuts( nSuppSize1+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = (int)(Delay == Delay1);
        }
        // find the best variable
        if ( Delay > (int)p->nDelayLim )
            continue;
        if ( Area > (int)p->nAreaLim )
            continue;
        nSuppSizeS = Abc_MinInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        nSuppSizeL = Abc_MaxInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        if ( nSuppSizeL > (int)p->nVars )
            continue;
        if ( pRes->Variable == -1 || pRes->AreaEst > Area || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL > nSuppSizeS + nSuppSizeL) || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL == nSuppSizeS + nSuppSizeL && pRes->DelayEst > Delay) )
        {
            pRes->Variable = Var;
            pRes->Polarity = Polarity;
            pRes->AreaEst  = Area;
            pRes->DelayEst = Delay;
            pRes->nSuppSizeS = nSuppSizeS;
            pRes->nSuppSizeL = nSuppSizeL;
        }
    }
    return pRes->Variable == -1 ? NULL : pRes;
}